

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O1

char * nrv_alloc(char *s,char **rve,int n)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar2 = rv_alloc(n);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    cVar1 = *s;
    *pcVar2 = cVar1;
    pcVar3 = pcVar2;
    if (cVar1 != '\0') {
      pcVar4 = s + 1;
      do {
        cVar1 = *pcVar4;
        pcVar3[1] = cVar1;
        pcVar3 = pcVar3 + 1;
        pcVar4 = pcVar4 + 1;
      } while (cVar1 != '\0');
    }
    if (rve != (char **)0x0) {
      *rve = pcVar3;
    }
  }
  return pcVar2;
}

Assistant:

static char *
nrv_alloc(char *s, char **rve, int n)
{
    char *rv, *t;

    rv = rv_alloc(n);
    if (rv == NULL)
        return NULL;
    t = rv;
    while((*t = *s++)) t++;
    if (rve)
        *rve = t;
    return rv;
}